

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_0::TestDynamicStructHandler::encode
          (TestDynamicStructHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  Field field_00;
  Field field_01;
  Reader input_00;
  Builder output_00;
  bool bVar1;
  bool bVar2;
  Type TVar3;
  Fault f;
  Field field;
  Builder items;
  FieldList fields;
  WirePointer *pWVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffffe98;
  uint uVar7;
  ListElementCount LVar8;
  char *pcVar9;
  undefined2 *puVar10;
  undefined7 in_stack_fffffffffffffeb9;
  undefined8 in_stack_fffffffffffffec0;
  Fault local_130;
  IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> local_128;
  Field local_118;
  ListBuilder local_d8;
  Reader local_b0;
  FieldList local_68;
  
  local_118.parent.super_Schema.raw = input.schema.super_Schema.raw;
  StructSchema::getFields(&local_68,&local_118.parent);
  capnp::json::Value::Builder::initArray
            ((Builder *)&local_d8,&output,local_68.list.reader.elementCount);
  local_128.index = 0;
  local_128.container = &local_68;
  while( true ) {
    if (local_128.index == local_68.list.reader.elementCount) {
      return;
    }
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              (&local_118,&local_128);
    pcVar9 = " < ";
    puVar10 = (undefined2 *)&DAT_00000004;
    bVar2 = local_118.index < local_d8.elementCount;
    if (!bVar2) break;
    uVar7 = local_118.index;
    LVar8 = local_d8.elementCount;
    ListBuilder::getStructElement
              ((StructBuilder *)&stack0xfffffffffffffea0,&local_d8,local_118.index);
    field_00._12_4_ = local_118._12_4_;
    field_00.index = local_118.index;
    field_00.parent.super_Schema.raw = local_118.parent.super_Schema.raw;
    field_00.proto._reader.segment = local_118.proto._reader.segment;
    field_00.proto._reader.capTable = local_118.proto._reader.capTable;
    field_00.proto._reader.data = local_118.proto._reader.data;
    field_00.proto._reader.pointers = local_118.proto._reader.pointers;
    field_00.proto._reader.dataSize = local_118.proto._reader.dataSize;
    field_00.proto._reader.pointerCount = local_118.proto._reader.pointerCount;
    field_00.proto._reader._38_2_ = local_118.proto._reader._38_2_;
    field_00.proto._reader.nestingLimit = local_118.proto._reader.nestingLimit;
    field_00.proto._reader._44_4_ = local_118.proto._reader._44_4_;
    bVar1 = DynamicStruct::Reader::has(&input,field_00,NON_NULL);
    if (bVar1) {
      field_01._12_4_ = local_118._12_4_;
      field_01.index = local_118.index;
      field_01.parent.super_Schema.raw = local_118.parent.super_Schema.raw;
      field_01.proto._reader.segment = local_118.proto._reader.segment;
      field_01.proto._reader.capTable = local_118.proto._reader.capTable;
      field_01.proto._reader.data = local_118.proto._reader.data;
      field_01.proto._reader.pointers = local_118.proto._reader.pointers;
      field_01.proto._reader.dataSize = local_118.proto._reader.dataSize;
      field_01.proto._reader.pointerCount = local_118.proto._reader.pointerCount;
      field_01.proto._reader._38_2_ = local_118.proto._reader._38_2_;
      field_01.proto._reader.nestingLimit = local_118.proto._reader.nestingLimit;
      field_01.proto._reader._44_4_ = local_118.proto._reader._44_4_;
      pWVar4 = local_118.proto._reader.pointers;
      uVar5 = local_118.proto._reader._32_8_;
      uVar6 = local_118.proto._reader._40_8_;
      DynamicStruct::Reader::get(&local_b0,&input,field_01);
      TVar3 = StructSchema::Field::getType(&local_118);
      input_00._4_4_ = LVar8;
      input_00.type = uVar7;
      input_00.field_1._17_7_ = in_stack_fffffffffffffeb9;
      input_00.field_1._16_1_ = bVar2;
      input_00.field_1.textValue.super_StringPtr.content.ptr = pcVar9;
      input_00.field_1.structValue.reader.segment = (SegmentReader *)puVar10;
      input_00.field_1.listValue.reader.capTable = (CapTableReader *)in_stack_fffffffffffffec0;
      input_00.field_1.listValue.reader.ptr = (byte *)pWVar4;
      input_00.field_1._40_4_ = (StructDataBitCount)uVar5;
      input_00.field_1._44_2_ = SUB82(uVar5,4);
      input_00.field_1._46_2_ = SUB82(uVar5,6);
      input_00.field_1._48_8_ = uVar6;
      input_00.field_1._56_8_ = in_stack_fffffffffffffe98;
      output_00._builder.segment._4_4_ = LVar8;
      output_00._builder.segment._0_4_ = uVar7;
      output_00._builder.capTable = (CapTableBuilder *)pcVar9;
      output_00._builder.data = puVar10;
      output_00._builder.pointers._0_1_ = bVar2;
      output_00._builder.pointers._1_7_ = in_stack_fffffffffffffeb9;
      output_00._builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffec0;
      output_00._builder.pointerCount = SUB82(in_stack_fffffffffffffec0,4);
      output_00._builder._38_2_ = SUB82(in_stack_fffffffffffffec0,6);
      TVar3.field_4.scopeId = TVar3._0_8_;
      TVar3._0_8_ = &local_b0;
      JsonCodec::encode(codec,input_00,TVar3,output_00);
      DynamicValue::Reader::~Reader(&local_b0);
    }
    else {
      *puVar10 = 0;
    }
    local_128.index = local_128.index + 1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&>
            (&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json-test.c++"
             ,0x2da,FAILED,"field.getIndex() < items.size()","_kjCondition,",
             (DebugComparison<unsigned_int,_unsigned_int> *)&stack0xfffffffffffffea0);
  kj::_::Debug::Fault::fatal(&local_130);
}

Assistant:

void encode(const JsonCodec& codec, DynamicStruct::Reader input,
              JsonValue::Builder output) const override {
    auto fields = input.getSchema().getFields();
    auto items = output.initArray(fields.size());
    for (auto field: fields) {
      KJ_REQUIRE(field.getIndex() < items.size());
      auto item = items[field.getIndex()];
      if (input.has(field)) {
        codec.encode(input.get(field), field.getType(), item);
      } else {
        item.setNull();
      }
    }
  }